

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImTextCountUtf8BytesFromStr(ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  while ((in_text < in_text_end || in_text_end == (ImWchar *)0x0 && (uVar1 = *in_text, uVar1 != 0)))
  {
    in_text = in_text + 1;
    if (uVar1 < 0x80) {
      iVar2 = iVar2 + 1;
    }
    else {
      iVar3 = 2;
      if (0x7ff < uVar1) {
        iVar3 = 0;
        if ((uVar1 & 0xfc00) != 0xdc00) {
          iVar3 = ((uVar1 & 0xfc00) == 0xd800) + 3;
        }
      }
      iVar2 = iVar2 + iVar3;
    }
  }
  return iVar2;
}

Assistant:

int ImTextCountUtf8BytesFromStr(const ImWchar* in_text, const ImWchar* in_text_end)
{
    int bytes_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            bytes_count++;
        else
            bytes_count += ImTextCountUtf8BytesFromChar(c);
    }
    return bytes_count;
}